

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

bool benchmark::CpuScalingEnabled(void)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  size_t sVar2;
  char (*in_R8) [26];
  char *local_90;
  size_t bytes_read;
  char buff [16];
  int local_50;
  FILE *file;
  string governor_file;
  int local_10;
  int num_cpus;
  int cpu;
  
  local_10 = 0;
  governor_file.field_2._12_4_ = NumCPUs();
  do {
    if ((int)governor_file.field_2._12_4_ <= local_10) {
LAB_0011dbdd:
      num_cpus._3_1_ = 0;
LAB_0011dbe1:
      return (bool)(num_cpus._3_1_ & 1);
    }
    StrCat<char_const(&)[28],int&,char_const(&)[26]>
              ((string *)&file,(benchmark *)"/sys/devices/system/cpu/cpu",(char (*) [28])&local_10,
               (int *)"/cpufreq/scaling_governor",in_R8);
    __filename = (char *)std::__cxx11::string::c_str();
    __stream = fopen(__filename,"r");
    if (__stream == (FILE *)0x0) {
      local_50 = 2;
    }
    else {
      sVar2 = fread(&bytes_read,1,0x10,__stream);
      fclose(__stream);
      if ((sVar2 < 0xb) || (iVar1 = memcmp(&bytes_read,"performance",0xb), iVar1 != 0)) {
        local_90 = (char *)0x0;
      }
      else {
        local_90 = buff + 3;
      }
      if (local_90 == (char *)0x0) {
        num_cpus._3_1_ = 1;
        local_50 = 1;
      }
      else {
        local_50 = 0;
      }
    }
    std::__cxx11::string::~string((string *)&file);
    if (local_50 != 0) {
      if (local_50 == 1) goto LAB_0011dbe1;
      goto LAB_0011dbdd;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

bool CpuScalingEnabled() {
#ifndef BENCHMARK_OS_WINDOWS
  // On Linux, the CPUfreq subsystem exposes CPU information as files on the
  // local file system. If reading the exported files fails, then we may not be
  // running on Linux, so we silently ignore all the read errors.
  for (int cpu = 0, num_cpus = NumCPUs(); cpu < num_cpus; ++cpu) {
    std::string governor_file = StrCat("/sys/devices/system/cpu/cpu", cpu,
                                       "/cpufreq/scaling_governor");
    FILE* file = fopen(governor_file.c_str(), "r");
    if (!file) break;
    char buff[16];
    size_t bytes_read = fread(buff, 1, sizeof(buff), file);
    fclose(file);
    if (memprefix(buff, bytes_read, "performance") == nullptr) return true;
  }
#endif
  return false;
}